

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathRect
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawCornerFlags rounding_corners)

{
  ImVec2 IVar1;
  ImVec2 *pIVar2;
  uint uVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  ImVec2 local_58;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = rounding;
  uVar3 = ~rounding_corners;
  fVar7 = 0.5;
  fVar9 = fVar7;
  if ((uVar3 & 0xc) != 0) {
    fVar9 = 1.0;
  }
  fVar15 = fVar7;
  if ((uVar3 & 3) != 0) {
    fVar15 = fVar9;
  }
  if ((uVar3 & 10) != 0) {
    fVar7 = 1.0;
  }
  fVar9 = 0.5;
  if ((uVar3 & 5) != 0) {
    fVar9 = fVar7;
  }
  if (rounding_corners != 0) {
    IVar1 = *a;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = IVar1.x;
    auVar11._4_4_ = IVar1.y;
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx(ZEXT416((uint)(b->x - IVar1.x)),auVar16);
    auVar13 = vmovshdup_avx(auVar11);
    auVar11 = vminss_avx(auVar10._0_16_,ZEXT416((uint)(auVar12._0_4_ * fVar15 + -1.0)));
    auVar12 = vandps_avx(ZEXT416((uint)(b->y - auVar13._0_4_)),auVar16);
    auVar12 = vminss_avx(auVar11,ZEXT416((uint)(auVar12._0_4_ * fVar9 + -1.0)));
    if (0.0 < auVar12._0_4_) {
      auVar11 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 1U) != 0) {
        auVar11 = auVar12;
      }
      auVar13 = ZEXT816(0);
      if ((rounding_corners & 2U) != 0) {
        auVar13 = auVar12;
      }
      local_4c = auVar13._0_4_;
      local_48 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 8U) != 0) {
        local_48 = auVar12;
      }
      auVar13 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 4U) != 0) {
        auVar13 = auVar12;
      }
      local_50 = auVar13._0_4_;
      fVar9 = auVar11._0_4_;
      auVar12._0_4_ = IVar1.x + fVar9;
      auVar12._4_4_ = IVar1.y + fVar9;
      auVar12._8_4_ = fVar9 + 0.0;
      auVar12._12_4_ = fVar9 + 0.0;
      local_58 = (ImVec2)vmovlps_avx(auVar12);
      PathArcToFast(this,&local_58,fVar9,6,9);
      local_58.y = local_4c + a->y;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      auVar14._8_8_ = 0;
      auVar14._0_4_ = b->x;
      auVar14._4_4_ = b->y;
      auVar13._4_4_ = local_48._0_4_;
      auVar13._0_4_ = local_48._0_4_;
      auVar13._8_4_ = local_48._0_4_;
      auVar13._12_4_ = local_48._0_4_;
      auVar12 = vsubps_avx(auVar14,auVar13);
      local_58 = (ImVec2)vmovlps_avx(auVar12);
      PathArcToFast(this,&local_58,(float)local_48._0_4_,0,3);
      local_58.y = b->y - local_50;
      local_58.x = local_50 + a->x;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  iVar6 = (this->_Path).Size;
  if (iVar6 == (this->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar8 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar8 = iVar5;
    }
    pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
    pIVar2 = (this->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar8;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  pIVar4[iVar6] = *a;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = b->x;
  fVar7 = a->y;
  if (iVar6 == (this->_Path).Capacity) {
    local_48._0_4_ = fVar7;
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar2 = (this->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
    fVar7 = (float)local_48._0_4_;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  pIVar4[iVar6].x = fVar9;
  pIVar4[iVar6].y = fVar7;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  if (iVar6 == (this->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar2 = (this->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  pIVar4[iVar6] = *b;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = a->x;
  fVar7 = b->y;
  if (iVar6 == (this->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar2 = (this->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  pIVar4[iVar6].x = fVar9;
  pIVar4[iVar6].y = fVar7;
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawCornerFlags rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}